

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O3

RayTracerConfig * RayTracerConfig::fromPlyFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  pointer *ppTVar1;
  pointer *__args;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  pointer pTVar5;
  RayTracerConfig *pRVar6;
  char cVar7;
  char cVar8;
  undefined2 uVar9;
  int iVar10;
  istream *piVar11;
  void *pvVar12;
  invalid_argument *piVar13;
  long *plVar14;
  long lVar15;
  pointer pRVar16;
  int iVar17;
  long lVar18;
  iterator __position;
  long lVar19;
  Vector VVar20;
  long local_318;
  ifstream file;
  int aiStack_2f8 [122];
  vector<Triangle,_std::allocator<Triangle>_> *local_110;
  undefined1 local_108 [8];
  string token;
  Vector v;
  void *pvStack_c8;
  vector<Point,_std::allocator<Point>_> vertices;
  undefined1 auStack_a8 [8];
  vector<RGB,_std::allocator<RGB>_> colors;
  string sss;
  undefined1 uStack_68;
  uint8_t uStack_67;
  undefined2 uStack_66;
  int iStack_64;
  int local_50;
  int local_4c;
  int vertexCount;
  int faceCount;
  int local_3c;
  int local_38;
  int g;
  int b;
  int v3;
  
  std::ifstream::ifstream(&local_318,(string *)path,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"Unable to open file: ",path);
    std::invalid_argument::invalid_argument
              (piVar13,(string *)
                       &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->super_BaseConfig).antiAliasing = 2;
  (__return_storage_ptr__->super_BaseConfig).maxRecursionLevel = 1;
  (__return_storage_ptr__->super_BaseConfig).ambientCoefficient = 0.1;
  (__return_storage_ptr__->super_BaseConfig).background.r = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.g = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.b = '\0';
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  _vertexCount = __return_storage_ptr__;
  std::operator>>((istream *)&local_318,(string *)local_108);
  iVar10 = std::__cxx11::string::compare(local_108);
  if (iVar10 != 0) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"Not a .ply file: ",path);
    std::invalid_argument::invalid_argument
              (piVar13,(string *)
                       &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::operator>>((istream *)&local_318,(string *)local_108);
  iVar10 = std::__cxx11::string::compare(local_108);
  if (iVar10 != 0) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Missing \'format\' specifier.");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar7 = std::ios::widen((char)(istream *)&local_318 + (char)*(undefined8 *)(local_318 + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_318,(string *)local_108,cVar7);
  local_50 = 0;
  local_4c = 0;
  vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pvStack_c8 = (void *)0x0;
  vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_110 = &_vertexCount->triangles;
  __args = &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
  do {
    piVar11 = std::operator>>((istream *)&local_318,(string *)local_108);
    if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) {
      if (auStack_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_a8,
                        (long)colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)auStack_a8);
      }
      pRVar6 = _vertexCount;
      if (pvStack_c8 != (void *)0x0) {
        operator_delete(pvStack_c8,
                        (long)vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pvStack_c8);
      }
      if (local_108 != (undefined1  [8])&token._M_string_length) {
        operator_delete((void *)local_108,
                        CONCAT71(token._M_string_length._1_7_,(undefined1)token._M_string_length) +
                        1);
      }
      std::ifstream::~ifstream(&local_318);
      return pRVar6;
    }
    iVar10 = std::__cxx11::string::compare((char *)local_108);
    cVar7 = (char)(istream *)&local_318;
    if (iVar10 == 0) {
      cVar8 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar7);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_318,(string *)local_108,cVar8);
    }
    iVar10 = std::__cxx11::string::compare((char *)local_108);
    if (iVar10 == 0) {
      std::operator>>((istream *)&local_318,(string *)local_108);
      std::istream::operator>>((istream *)&local_318,&local_50);
      iVar10 = std::__cxx11::string::compare((char *)local_108);
      if (iVar10 == 0) {
        std::operator>>((istream *)&local_318,(string *)local_108);
        while (iVar10 = std::__cxx11::string::compare((char *)local_108), iVar10 == 0) {
          std::operator>>((istream *)&local_318,(string *)local_108);
          iVar10 = std::__cxx11::string::compare((char *)local_108);
          cVar8 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar7);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_318,(string *)local_108,cVar8);
          vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               (pointer)CONCAT71((int7)((ulong)vertices.
                                               super__Vector_base<Point,_std::allocator<Point>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage >>
                                       8),(byte)vertices.
                                                super__Vector_base<Point,_std::allocator<Point>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage |
                                          iVar10 == 0);
          std::operator>>((istream *)&local_318,(string *)local_108);
        }
      }
      std::operator>>((istream *)&local_318,(string *)local_108);
      std::istream::operator>>((istream *)&local_318,&local_4c);
      iVar10 = std::__cxx11::string::compare((char *)local_108);
      if (iVar10 != 0) {
        piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&token.field_2 + 8),"Unknown element \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        plVar14 = (long *)std::__cxx11::string::append(token.field_2._M_local_buf + 8);
        colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)*plVar14;
        pRVar16 = (pointer)(plVar14 + 2);
        if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage == pRVar16) {
          sss.field_2._M_allocated_capacity = plVar14[3];
          sss._M_string_length._0_4_ = (uint)*(long *)pRVar16;
          sss._M_string_length._4_4_ = (undefined4)((ulong)*(long *)pRVar16 >> 0x20);
          colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&sss._M_string_length;
        }
        else {
          sss._M_string_length._0_4_ = (uint)*(long *)pRVar16;
          sss._M_string_length._4_4_ = (undefined4)((ulong)*(long *)pRVar16 >> 0x20);
        }
        sss._M_dataplus._M_p._0_4_ = (undefined4)plVar14[1];
        sss._M_dataplus._M_p._4_4_ = (undefined4)((ulong)plVar14[1] >> 0x20);
        *plVar14 = (long)pRVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::invalid_argument::invalid_argument
                  (piVar13,(string *)
                           &colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::operator>>((istream *)&local_318,(string *)local_108);
      while (iVar10 = std::__cxx11::string::compare((char *)local_108), iVar10 == 0) {
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar7);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_318,(string *)local_108,cVar8);
        std::operator>>((istream *)&local_318,(string *)local_108);
      }
    }
    iVar10 = std::__cxx11::string::compare((char *)local_108);
    if (iVar10 == 0) {
      if (0 < local_50) {
        iVar10 = 0;
        do {
          piVar11 = std::istream::_M_extract<float>((float *)&local_318);
          piVar11 = std::istream::_M_extract<float>((float *)piVar11);
          std::istream::_M_extract<float>((float *)piVar11);
          if (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_start ==
              vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
                      ((vector<Point,std::allocator<Point>> *)&pvStack_c8,
                       (iterator)
                       vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                       super__Vector_impl_data._M_start,(Point *)((long)&token.field_2 + 8));
          }
          else {
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->z = v.x;
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->x = (float)token.field_2._8_4_;
            (vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_start)->y = (float)token.field_2._12_4_;
            vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start =
                 vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          if (((ulong)vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) == 0) {
            colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)CONCAT53(colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._3_5_,0x646464);
            if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start !=
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_finish) {
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->b = 'd';
              uVar9 = 0x6464;
              goto LAB_0010a081;
            }
            std::vector<RGB,_std::allocator<RGB>_>::_M_realloc_insert<RGB>
                      ((vector<RGB,_std::allocator<RGB>_> *)auStack_a8,
                       (iterator)
                       colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                       super__Vector_impl_data._M_start,(RGB *)__args);
          }
          else {
            pvVar12 = (void *)std::istream::operator>>((istream *)&local_318,(int *)__args);
            pvVar12 = (void *)std::istream::operator>>(pvVar12,&local_3c);
            std::istream::operator>>(pvVar12,&local_38);
            iVar17 = g;
            g._0_2_ = CONCAT11((undefined1)local_3c,
                               colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_1_);
            g._3_1_ = SUB41(iVar17,3);
            g._0_3_ = CONCAT12((uint8_t)local_38,(undefined2)g);
            if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start ==
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_finish) {
              std::vector<RGB,_std::allocator<RGB>_>::_M_realloc_insert<RGB>
                        ((vector<RGB,_std::allocator<RGB>_> *)auStack_a8,
                         (iterator)
                         colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_start,(RGB *)&g);
            }
            else {
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->b = (uint8_t)local_38;
              uVar9 = (undefined2)g;
LAB_0010a081:
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->r = (char)uVar9;
              (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start)->g = (char)((ushort)uVar9 >> 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_start = colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
            }
          }
          colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&sss._M_string_length;
          sss._M_dataplus._M_p._0_4_ = 0;
          sss._M_dataplus._M_p._4_4_ = 0;
          sss._M_string_length._0_4_ = (uint)sss._M_string_length & 0xffffff00;
          iVar17 = 0xb;
          do {
            std::operator>>((istream *)&local_318,(string *)__args);
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
          if (colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage != (pointer)&sss._M_string_length) {
            operator_delete(colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                            CONCAT44(sss._M_string_length._4_4_,(uint)sss._M_string_length) + 1);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < local_50);
      }
      if (0 < local_4c) {
        iVar10 = 0;
        do {
          std::istream::operator>>((istream *)&local_318,(int *)(token.field_2._M_local_buf + 8));
          if (token.field_2._8_4_ == 3) {
            pvVar12 = (void *)std::istream::operator>>((istream *)&local_318,&local_3c);
            pvVar12 = (void *)std::istream::operator>>(pvVar12,&local_38);
            std::istream::operator>>(pvVar12,&g);
            if (auStack_a8 ==
                (undefined1  [8])
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start) {
              sss._M_dataplus._M_p._0_4_ =
                   *(undefined4 *)((long)pvStack_c8 + (long)local_3c * 0xc + 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = *(pointer *)((long)pvStack_c8 + (long)local_3c * 0xc);
              uVar4 = *(undefined8 *)((long)pvStack_c8 + (long)local_38 * 0xc);
              sss._M_dataplus._M_p._4_4_ = (undefined4)uVar4;
              sss._M_string_length._0_4_ = (uint)((ulong)uVar4 >> 0x20);
              sss._M_string_length._4_4_ =
                   *(undefined4 *)((long)pvStack_c8 + (long)local_38 * 0xc + 8);
              sss.field_2._M_allocated_capacity = *(size_type *)((long)pvStack_c8 + (long)g * 0xc);
              sss.field_2._8_4_ = *(undefined4 *)((long)pvStack_c8 + (long)g * 0xc + 8);
              sss.field_2._12_2_ = 0xc828;
              sss.field_2._M_local_buf[0xe] = '(';
              sss.field_2._M_local_buf[0xf] = '2';
              uStack_68 = 0x32;
              uStack_67 = 200;
              uStack_66 = 0;
              iStack_64 = (uint)iStack_64._1_3_ << 8;
              __position._M_current =
                   (_vertexCount->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (_vertexCount->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010a311;
              std::vector<Triangle,_std::allocator<Triangle>_>::_M_realloc_insert<Triangle>
                        (local_110,__position,(Triangle *)__args);
            }
            else {
              lVar15 = (long)local_3c;
              sss._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)pvStack_c8 + lVar15 * 0xc + 8);
              colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = *(pointer *)((long)pvStack_c8 + lVar15 * 0xc);
              lVar18 = (long)local_38;
              sss._M_string_length._4_4_ = *(undefined4 *)((long)pvStack_c8 + lVar18 * 0xc + 8);
              uVar4 = *(undefined8 *)((long)pvStack_c8 + lVar18 * 0xc);
              sss._M_dataplus._M_p._4_4_ = (undefined4)uVar4;
              sss._M_string_length._0_4_ = (uint)((ulong)uVar4 >> 0x20);
              lVar19 = (long)g;
              sss.field_2._8_4_ = *(undefined4 *)((long)pvStack_c8 + lVar19 * 0xc + 8);
              sss.field_2._M_allocated_capacity = *(size_type *)((long)pvStack_c8 + lVar19 * 0xc);
              sss.field_2._M_local_buf[0xe] = ((pointer)((long)auStack_a8 + lVar15 * 3))->b;
              sss.field_2._12_1_ = ((pointer)((long)auStack_a8 + lVar15 * 3))->r;
              sss.field_2._13_1_ = ((pointer)((long)auStack_a8 + lVar15 * 3))->g;
              uStack_67 = ((pointer)((long)auStack_a8 + lVar18 * 3))->b;
              uVar2 = ((pointer)((long)auStack_a8 + lVar18 * 3))->r;
              uVar3 = ((pointer)((long)auStack_a8 + lVar18 * 3))->g;
              iStack_64 = CONCAT31(iStack_64._1_3_,((pointer)((long)auStack_a8 + lVar19 * 3))->b);
              uStack_66._0_1_ = ((pointer)((long)auStack_a8 + lVar19 * 3))->r;
              uStack_66._1_1_ = ((pointer)((long)auStack_a8 + lVar19 * 3))->g;
              __position._M_current =
                   (_vertexCount->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              sss.field_2._M_local_buf[0xf] = uVar2;
              uStack_68 = uVar3;
              if (__position._M_current ==
                  (_vertexCount->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Triangle,_std::allocator<Triangle>_>::_M_realloc_insert<Triangle>
                          (local_110,__position,(Triangle *)__args);
              }
              else {
LAB_0010a311:
                ((__position._M_current)->normal).x = 0.0;
                ((__position._M_current)->normal).y = 0.0;
                *(undefined8 *)&((__position._M_current)->normal).z = 0x3dcccccd00000000;
                *(ulong *)&((__position._M_current)->z).z =
                     CONCAT17(sss.field_2._M_local_buf[0xf],
                              CONCAT16(sss.field_2._M_local_buf[0xe],
                                       CONCAT24(sss.field_2._12_2_,sss.field_2._8_4_)));
                *(ulong *)&((__position._M_current)->colorY).g =
                     CONCAT44(iStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,uStack_68)));
                ((__position._M_current)->y).y = (float)(uint)sss._M_string_length;
                ((__position._M_current)->y).z = (float)sss._M_string_length._4_4_;
                ((__position._M_current)->z).x = (float)sss.field_2._M_allocated_capacity._0_4_;
                ((__position._M_current)->z).y = (float)sss.field_2._4_4_;
                *(pointer *)&(__position._M_current)->x =
                     colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                *(ulong *)&((__position._M_current)->x).z =
                     CONCAT44(sss._M_dataplus._M_p._4_4_,sss._M_dataplus._M_p._0_4_);
                ppTVar1 = &(_vertexCount->triangles).
                           super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppTVar1 = *ppTVar1 + 1;
              }
            }
            pRVar6 = _vertexCount;
            VVar20 = getNormalVector((_vertexCount->triangles).
                                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                                     .super__Vector_impl_data._M_finish + -1);
            pTVar5 = (pRVar6->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pTVar5[-1].normal.x = (float)(int)VVar20._0_8_;
            pTVar5[-1].normal.y = (float)(int)((ulong)VVar20._0_8_ >> 0x20);
            pTVar5[-1].normal.z = VVar20.z;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Warning: only triangles are supported",0x25);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            cVar8 = std::ios::widen((char)*(undefined8 *)(local_318 + -0x18) + cVar7);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_318,(string *)local_108,cVar8);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < local_4c);
      }
    }
    if (*(int *)((long)aiStack_2f8 + *(long *)(local_318 + -0x18)) != 0) {
      piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar13,"Invalid config file format.");
      __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  } while( true );
}

Assistant:

RayTracerConfig RayTracerConfig::fromPlyFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  file >> token;
  if (token != "ply")
    throw std::invalid_argument("Not a .ply file: " + path);
  file >> token;
  if (token != "format")
    throw std::invalid_argument("Missing 'format' specifier.");
  std::getline(file, token);

  int vertexCount = 0;
  int faceCount = 0;

  std::vector<Vector> vertices;
  std::vector<RGB> colors;
  bool isRGB = false;
  while (file >> token)
  {
    if (token == "comment")
      std::getline(file, token);
    if (token == "element")
    {
      file >> token;
      file >> vertexCount;
      if (token == "vertex")
      {
        // assume format x y z, ignore other
        file >> token;
        while (token == "property")
        {
          file >> token;
          if (token == "uchar")
            isRGB = true;

          std::getline(file, token);
          file >> token;
        }
      }
      file >> token;
      file >> faceCount;
      if (token == "face")
      {
        // assume property list uchar int vertex_indices
        file >> token;
        while (token == "property")
        {
          std::getline(file, token);
          file >> token;
        }
      }
      else
        throw std::invalid_argument("Unknown element '" + token
                                    + "', only 'vertex' and 'face' are supported");
    }
    if (token == "end_header")
    {
      for (int i = 0; i < vertexCount; ++i)
      {
        Vector v;
        file >> v.x >> v.y >> v.z;
        vertices.push_back(v);

        if (isRGB)
        {
          int r, g, b;
          file >> r >> g >> b;
          colors.push_back({uint8_t(r), uint8_t(g), uint8_t(b)});
        }
        else
          colors.push_back({100, 100, 100});
        
        // only for sponza
        std::string sss; for(int j=0; j<11; j++) file >> sss;
      }

      for (int i = 0; i < faceCount; ++i)
      {
        int count;
        file >> count;
        if (count != 3) // only triangles supported
        {
          std::cerr << "Warning: only triangles are supported" << std::endl;
          std::getline(file, token);
          continue;
        }
        int v1, v2, v3;
        file >> v1 >> v2 >> v3;
        // RGB color{uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
        if (colors.empty())
          config.triangles.emplace_back(Triangle{
              vertices[v1], vertices[v2], vertices[v3], {40, 200, 40}, {50, 50, 200}, {0, 0, 0}});
        else
          config.triangles.emplace_back(Triangle{vertices[v1], vertices[v2], vertices[v3],
                                                 colors[v1], colors[v2], colors[v3]});
        config.triangles[config.triangles.size()-1].normal = getNormalVector(config.triangles[config.triangles.size()-1]);
      }
    }
    // else
    //  throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}